

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gltf.cpp
# Opt level: O0

bool vera::loadModel(string *_filename,Model *_model)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  ostream *poVar5;
  allocator local_131;
  string local_130;
  allocator local_109;
  string local_108;
  byte local_e5;
  bool res;
  undefined1 local_d8 [8];
  string ext;
  string warn;
  string err;
  TinyGLTF loader;
  Model *_model_local;
  string *_filename_local;
  
  tinygltf::TinyGLTF::TinyGLTF((TinyGLTF *)((long)&err.field_2 + 8));
  std::__cxx11::string::string((string *)(warn.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(ext.field_2._M_local_buf + 8));
  getExt((string *)local_d8,_filename);
  local_e5 = 0;
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_d8,"glb");
  if (!bVar2) {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_d8,"GLB");
    if (!bVar2) {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_130,pcVar3,&local_131);
      local_e5 = tinygltf::TinyGLTF::LoadASCIIFromFile
                           ((TinyGLTF *)((long)&err.field_2 + 8),_model,
                            (string *)((long)&warn.field_2 + 8),(string *)((long)&ext.field_2 + 8),
                            &local_130,1);
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator((allocator<char> *)&local_131);
      goto LAB_0052594f;
    }
  }
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,pcVar3,&local_109);
  local_e5 = tinygltf::TinyGLTF::LoadBinaryFromFile
                       ((TinyGLTF *)((long)&err.field_2 + 8),_model,
                        (string *)((long)&warn.field_2 + 8),(string *)((long)&ext.field_2 + 8),
                        &local_108,1);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
LAB_0052594f:
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Warn: ");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    poVar5 = std::operator<<(poVar5,pcVar3);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"ERR: ");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    poVar5 = std::operator<<(poVar5,pcVar3);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  bVar1 = local_e5;
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string((string *)(ext.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(warn.field_2._M_local_buf + 8));
  tinygltf::TinyGLTF::~TinyGLTF((TinyGLTF *)((long)&err.field_2 + 8));
  return (bool)(bVar1 & 1);
}

Assistant:

bool loadModel(const std::string& _filename, tinygltf::Model& _model) {
    tinygltf::TinyGLTF loader;
    std::string err;
    std::string warn;
    std::string ext = getExt(_filename);

    bool res = false;

    // assume binary glTF.
    if (ext == "glb" || ext == "GLB")
        res = loader.LoadBinaryFromFile(&_model, &err, &warn, _filename.c_str());

    // assume ascii glTF.
    else
        res = loader.LoadASCIIFromFile(&_model, &err, &warn, _filename.c_str());

    if (!warn.empty())
        std::cout << "Warn: " << warn.c_str() << std::endl;

    if (!err.empty())
        std::cout << "ERR: " << err.c_str() << std::endl;

    return res;
}